

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_list_view_begin(nk_context *ctx,nk_list_view *view,char *title,nk_flags flags,int row_height,
                      int row_count)

{
  nk_window *win;
  nk_panel *pnVar1;
  long lVar2;
  int iVar3;
  nk_hash name;
  int iVar4;
  nk_table *iter;
  nk_table *pnVar5;
  nk_uint *y_offset;
  nk_uint value;
  nk_table *pnVar6;
  ulong uVar7;
  nk_uint *extraout_RDX;
  undefined7 uVar8;
  nk_uint *unaff_RBP;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5696,
                  "int nk_list_view_begin(struct nk_context *, struct nk_list_view *, const char *, nk_flags, int, int)"
                 );
  }
  if (view == (nk_list_view *)0x0) {
    __assert_fail("view",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5697,
                  "int nk_list_view_begin(struct nk_context *, struct nk_list_view *, const char *, nk_flags, int, int)"
                 );
  }
  if (title == (char *)0x0) {
    __assert_fail("title",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5698,
                  "int nk_list_view_begin(struct nk_context *, struct nk_list_view *, const char *, nk_flags, int, int)"
                 );
  }
  iVar3 = (int)(ctx->style).window.spacing.y;
  win = ctx->current;
  lVar10 = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  if (*title != '\0') {
    lVar10 = 0;
    do {
      lVar2 = lVar10 + 1;
      lVar10 = lVar10 + 1;
    } while (title[lVar2] != '\0');
  }
  name = nk_murmur_hash(title,(int)lVar10,2);
  pnVar5 = win->tables;
  pnVar6 = pnVar5;
  y_offset = extraout_RDX;
  do {
    if (pnVar6 == (nk_table *)0x0) {
      unaff_RBP = (nk_uint *)0x0;
      break;
    }
    uVar11 = (ulong)pnVar6->size;
    uVar8 = (undefined7)((ulong)y_offset >> 8);
    y_offset = (nk_uint *)CONCAT71(uVar8,uVar11 != 0);
    if (uVar11 == 0) {
LAB_0013b844:
      pnVar6 = pnVar6->next;
    }
    else {
      if (pnVar6->keys[0] == name) {
        y_offset = (nk_uint *)CONCAT71(uVar8,1);
        uVar12 = 0;
      }
      else {
        uVar7 = 0;
        do {
          if (uVar11 - 1 == uVar7) {
            y_offset = (nk_uint *)CONCAT71((int7)(uVar7 + 1 >> 8),uVar7 + 1 < uVar11);
            goto LAB_0013b844;
          }
          uVar12 = uVar7 + 1;
          lVar10 = uVar7 + 1;
          uVar7 = uVar12;
        } while (pnVar6->keys[lVar10] != name);
        y_offset = (nk_uint *)CONCAT71((int7)(uVar12 >> 8),uVar12 < uVar11);
      }
      pnVar6->seq = win->seq;
      unaff_RBP = pnVar6->values + uVar12;
    }
  } while ((char)y_offset == '\0');
  value = (nk_uint)pnVar6;
  if (unaff_RBP == (nk_uint *)0x0) {
    unaff_RBP = nk_add_value(ctx,win,name,value);
    y_offset = nk_add_value(ctx,win,name + 1,value);
    *y_offset = 0;
    *unaff_RBP = 0;
  }
  else {
    do {
      uVar11 = (ulong)pnVar5->size;
      bVar13 = uVar11 != 0;
      if (uVar11 == 0) {
LAB_0013b8ad:
        pnVar5 = pnVar5->next;
      }
      else {
        if (pnVar5->keys[0] == name + 1) {
          bVar13 = true;
          uVar12 = 0;
        }
        else {
          uVar7 = 0;
          do {
            if (uVar11 - 1 == uVar7) {
              bVar13 = uVar7 + 1 < uVar11;
              goto LAB_0013b8ad;
            }
            uVar12 = uVar7 + 1;
            lVar10 = uVar7 + 1;
            uVar7 = uVar12;
          } while (pnVar5->keys[lVar10] != name + 1);
          bVar13 = uVar12 < uVar11;
        }
        pnVar5->seq = win->seq;
        y_offset = pnVar5->values + uVar12;
      }
    } while (!bVar13);
  }
  view->scroll_value = *y_offset;
  view->scroll_pointer = y_offset;
  *y_offset = 0;
  iVar4 = nk_group_scrolled_offset_begin(ctx,unaff_RBP,y_offset,title,flags);
  pnVar1 = ctx->current->layout;
  iVar9 = 1;
  if (1 < row_count) {
    iVar9 = row_count;
  }
  view->total_height = iVar9 * (iVar3 + row_height);
  fVar15 = (float)(iVar3 + row_height);
  fVar14 = (float)view->scroll_value / fVar15;
  iVar3 = (int)(float)(~-(uint)(fVar14 <= 0.0) & (uint)fVar14);
  view->begin = iVar3;
  fVar15 = (pnVar1->clip).h / fVar15;
  if ((int)((uint)((float)(int)fVar15 < fVar15) + (int)fVar15) < 0) {
    iVar9 = 0;
  }
  else {
    iVar9 = (uint)((float)(int)fVar15 < fVar15) + (int)fVar15;
  }
  view->count = iVar9;
  view->end = iVar3 + iVar9;
  view->ctx = ctx;
  return iVar4;
}

Assistant:

NK_API int
nk_list_view_begin(struct nk_context *ctx, struct nk_list_view *view,
    const char *title, nk_flags flags, int row_height, int row_count)
{
    int title_len;
    nk_hash title_hash;
    nk_uint *x_offset;
    nk_uint *y_offset;

    int result;
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_style *style;
    struct nk_vec2 item_spacing;

    NK_ASSERT(ctx);
    NK_ASSERT(view);
    NK_ASSERT(title);
    if (!ctx || !view || !title) return 0;

    win = ctx->current;
    style = &ctx->style;
    item_spacing = style->window.spacing;
    row_height += NK_MAX(0, (int)item_spacing.y);

    /* find persistent list view scrollbar offset */
    title_len = (int)nk_strlen(title);
    title_hash = nk_murmur_hash(title, (int)title_len, NK_PANEL_GROUP);
    x_offset = nk_find_value(win, title_hash);
    if (!x_offset) {
        x_offset = nk_add_value(ctx, win, title_hash, 0);
        y_offset = nk_add_value(ctx, win, title_hash+1, 0);

        NK_ASSERT(x_offset);
        NK_ASSERT(y_offset);
        if (!x_offset || !y_offset) return 0;
        *x_offset = *y_offset = 0;
    } else y_offset = nk_find_value(win, title_hash+1);
    view->scroll_value = *y_offset;
    view->scroll_pointer = y_offset;

    *y_offset = 0;
    result = nk_group_scrolled_offset_begin(ctx, x_offset, y_offset, title, flags);
    win = ctx->current;
    layout = win->layout;

    view->total_height = row_height * NK_MAX(row_count,1);
    view->begin = (int)NK_MAX(((float)view->scroll_value / (float)row_height), 0.0f);
    view->count = (int)NK_MAX(nk_iceilf((layout->clip.h)/(float)row_height), 0);
    view->end = view->begin + view->count;
    view->ctx = ctx;
    return result;
}